

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * GenImageChecked(Image *__return_storage_ptr__,int width,int height,int checksX,int checksY,
                       Color col1,Color col2)

{
  Color CVar1;
  void *pvVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pvVar2 = malloc((long)(height * width) << 2);
  uVar3 = 0;
  uVar6 = 0;
  if (0 < width) {
    uVar6 = (ulong)(uint)width;
  }
  uVar7 = 0;
  if (0 < height) {
    uVar7 = (ulong)(uint)height;
  }
  pvVar4 = pvVar2;
  for (; uVar3 != uVar7; uVar3 = uVar3 + 1) {
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      CVar1 = col2;
      if (((int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                (long)checksY) +
           (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                (long)checksX) & 1U) == 0) {
        CVar1 = col1;
      }
      *(Color *)((long)pvVar4 + uVar5 * 4) = CVar1;
    }
    pvVar4 = (void *)((long)pvVar4 + (long)width * 4);
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageChecked(int width, int height, int checksX, int checksY, Color col1, Color col2)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            if ((x/checksX + y/checksY)%2 == 0) pixels[y*width + x] = col1;
            else pixels[y*width + x] = col2;
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}